

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O2

int Abc_NtkRetimeTiming_rec(Abc_Obj_t *pObj,int fForward)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    lVar4 = 0;
    iVar1 = 0;
    if (fForward == 0) {
      for (; lVar4 < (pObj->vFanins).nSize; lVar4 = lVar4 + 1) {
        iVar2 = Abc_NtkRetimeTiming_rec
                          ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]],0);
        if (iVar1 <= iVar2) {
          iVar1 = iVar2;
        }
      }
    }
    else {
      for (; lVar4 < (pObj->vFanouts).nSize; lVar4 = lVar4 + 1) {
        iVar2 = Abc_NtkRetimeTiming_rec
                          ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],
                           fForward);
        if (iVar1 <= iVar2) {
          iVar1 = iVar2;
        }
      }
    }
    uVar3 = iVar1 * 0x1000 + 0x1000;
    *(uint *)&pObj->field_0x14 = (*(uint *)&pObj->field_0x14 & 0xfff) + iVar1 * 0x1000 + 0x1000;
  }
  else {
    uVar3 = *(uint *)&pObj->field_0x14;
  }
  return uVar3 >> 0xc;
}

Assistant:

int Abc_NtkRetimeTiming_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i, LevelCur, LevelMax = 0;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->Level;
    Abc_NodeSetTravIdCurrent(pObj);
    // visit the next nodes
    if ( fForward )
    {
        Abc_ObjForEachFanout( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
    else
    {
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
//    printf( "Node %3d -> Level %3d.\n", pObj->Id, LevelMax + 1 );
    pObj->Level = LevelMax + 1;
    return pObj->Level;
}